

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdt.cpp
# Opt level: O0

double __thiscall CDT::feed_forward(CDT *this,vector<double,_std::allocator<double>_> *inputs)

{
  size_type sVar1;
  const_reference pvVar2;
  const_reference pvVar3;
  double dVar4;
  uint local_2c;
  uint i;
  double output;
  double key;
  vector<double,_std::allocator<double>_> *inputs_local;
  CDT *this_local;
  
  output = 0.0;
  local_2c = 0;
  while( true ) {
    sVar1 = std::vector<double,_std::allocator<double>_>::size(inputs);
    if (sVar1 <= local_2c) break;
    pvVar2 = std::vector<Layer,_std::allocator<Layer>_>::operator[](&this->m_layers,0);
    dVar4 = Matrix<double>::get(&pvVar2->m_weights,0,local_2c);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](inputs,(ulong)local_2c);
    output = dVar4 * *pvVar3 + output;
    local_2c = local_2c + 1;
  }
  dVar4 = Activation::run(&this->m_function,output);
  return dVar4;
}

Assistant:

double CDT::feed_forward(const std::vector<double>& inputs) const{
    double key=0., output;
    
    for(unsigned i=0;i<inputs.size();++i){
        key+=m_layers[0].m_weights.get(0,i)*inputs[i];
    }
    // std::cout<<" : key: "<<key<<'\n';
    output=m_function.run(key);

    return output;
}